

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001c3810 = 0x2e2e2e2e2e2e2e;
    uRam00000000001c3817 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001c3800 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c3808 = 0x2e2e2e2e2e2e2e;
    DAT_001c380f = 0x2e;
    _DAT_001c37f0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c37f8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_001c37e0 = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c37e8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam00000000001c37d8 = 0x2e2e2e2e2e2e2e2e;
    DAT_001c381f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }